

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O0

int yyrefill(GREG *G)

{
  int iVar1;
  char *pcVar2;
  uint local_24;
  int c;
  int yyn;
  GREG *G_local;
  
  while (G->buflen - G->pos < 0x200) {
    G->buflen = G->buflen << 1;
    pcVar2 = (char *)realloc(G->buf,(long)G->buflen);
    G->buf = pcVar2;
  }
  iVar1 = getc((FILE *)input);
  if ((iVar1 == 10) || (iVar1 == 0xd)) {
    lineNumber = lineNumber + 1;
  }
  if (iVar1 != -1) {
    G->buf[G->pos] = (char)iVar1;
  }
  local_24 = (uint)(iVar1 != -1);
  if (local_24 != 0) {
    G->limit = local_24 + G->limit;
  }
  G_local._4_4_ = (uint)(local_24 != 0);
  return G_local._4_4_;
}

Assistant:

YY_LOCAL(int) yyrefill(GREG *G)
{
  int yyn;
  while (G->buflen - G->pos < 512)
    {
      G->buflen *= 2;
      G->buf= (char*)YY_REALLOC(G->buf, G->buflen, G->data);
    }
  YY_INPUT((G->buf + G->pos), yyn, (G->buflen - G->pos), G->data);
  if (!yyn) return 0;
  G->limit += yyn;
  return 1;
}